

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_base64Binary(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  byte bVar1;
  bool bVar2;
  XMLCh *pXVar3;
  char *pcVar4;
  XSValue *pXVar5;
  char *pcVar6;
  char *pcVar7;
  wchar16 *pwVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  StrX local_420;
  StrX local_410;
  StrX local_400;
  long local_3f0;
  XMLCh *actRetCanRep_3;
  undefined1 local_3e0 [4];
  Status myStatus_11;
  StrX local_3d0;
  StrX local_3c0;
  long local_3b0;
  XMLCh *actRetCanRep_2;
  undefined1 local_3a0 [4];
  Status myStatus_10;
  StrX local_390;
  char *local_380;
  char *actRetCanRep_inchar_1;
  wchar16 *local_368;
  XMLCh *actRetCanRep_1;
  undefined1 local_358 [4];
  Status myStatus_9;
  StrX local_348;
  char *local_338;
  char *actRetCanRep_inchar;
  wchar16 *local_320;
  XMLCh *actRetCanRep;
  Status myStatus_8;
  int j;
  StrX local_300;
  StrX local_2f0;
  XSValue *local_2e0;
  XSValue *actRetValue_3;
  undefined1 local_2d0 [4];
  Status myStatus_7;
  StrX local_2c0;
  StrX local_2b0;
  XSValue *local_2a0;
  XSValue *actRetValue_2;
  undefined1 local_290 [4];
  Status myStatus_6;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  StrX local_230;
  XSValue *local_220;
  XSValue *actRetValue_1;
  undefined1 local_210 [4];
  Status myStatus_5;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  StrX local_1b0;
  XSValue *local_1a0;
  XSValue *actRetValue;
  Status myStatus_4;
  int i;
  StrX local_180;
  StrX local_170;
  byte local_15d;
  Status local_15c;
  undefined1 local_158 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_148;
  StrX local_138;
  byte local_125;
  Status local_124;
  undefined1 local_120 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_110;
  byte local_fd;
  Status local_fc;
  undefined1 local_f8 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_d8;
  byte local_c5;
  Status local_c4;
  char acStack_c0 [3];
  bool actRetValid;
  Status myStatus;
  char lex_v_2_canrep [9];
  char lex_v_1_canrep [13];
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  char lex_iv_1 [8];
  char lex_iv_2 [12];
  char lex_v_2 [10];
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char lex_v_1 [21];
  bool toValidate;
  DataType dt;
  
  lex_v_2[8] = ' ';
  lex_v_2[9] = ' ';
  cStack_26 = '1';
  cStack_25 = '3';
  cStack_24 = '4';
  cStack_23 = 'x';
  cStack_22 = ' ';
  cStack_21 = 'c';
  stack0xffffffffffffffc8 = 0x346538207a747877;
  lex_v_2[0] = 'k';
  lex_v_2[1] = '\0';
  builtin_strncpy(lex_iv_1,"134xcv56",8);
  lex_iv_2[0] = 'g';
  lex_iv_2[1] = 'u';
  lex_iv_2[2] = 'i';
  lex_iv_2[3] = '\0';
  act_v_ran_v_1.fValue.f_datetime.f_milisec = 1.1345313972417294e-307;
  act_v_ran_v_1._0_8_ = operator_new__(9);
  *(undefined1 *)act_v_ran_v_1._0_8_ = 0xd7;
  *(undefined1 *)(act_v_ran_v_1._0_8_ + 1) = 0x7e;
  *(undefined1 *)(act_v_ran_v_1._0_8_ + 2) = 0x31;
  *(undefined1 *)(act_v_ran_v_1._0_8_ + 3) = 0x72;
  *(undefined1 *)(act_v_ran_v_1._0_8_ + 4) = 0xfe;
  *(undefined1 *)(act_v_ran_v_1._0_8_ + 5) = 0x7a;
  *(undefined1 *)(act_v_ran_v_1._0_8_ + 6) = 0x82;
  *(undefined1 *)(act_v_ran_v_1._0_8_ + 7) = 0xe8;
  *(undefined1 *)(act_v_ran_v_1._0_8_ + 8) = 0xb4;
  act_v_ran_v_2._0_8_ = operator_new__(9);
  *(undefined1 *)act_v_ran_v_2._0_8_ = 0xc3;
  *(undefined1 *)(act_v_ran_v_2._0_8_ + 1) = 0x1b;
  *(undefined1 *)(act_v_ran_v_2._0_8_ + 2) = 0x73;
  *(undefined1 *)(act_v_ran_v_2._0_8_ + 3) = 0xf1;
  *(undefined1 *)(act_v_ran_v_2._0_8_ + 4) = 0xee;
  *(undefined1 *)(act_v_ran_v_2._0_8_ + 5) = 0x24;
  *(undefined1 *)(act_v_ran_v_2._0_8_ + 6) = 0;
  *(undefined1 *)(act_v_ran_v_2._0_8_ + 7) = 0;
  *(undefined1 *)(act_v_ran_v_2._0_8_ + 8) = 0;
  builtin_strncpy(lex_v_1_canrep,"gui0",5);
  stack0xffffffffffffff50 = 0x6378343331;
  _acStack_c0 = 0x6b3465387a747877;
  lex_v_2_canrep[0] = '\0';
  local_c4 = st_Init;
  StrX::StrX(&local_d8,lex_v_2 + 8);
  pXVar3 = StrX::unicodeForm(&local_d8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_base64Binary,&local_c4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  local_c5 = bVar1 & 1;
  if (local_c5 != 1) {
    pXVar3 = getDataTypeString(dt_base64Binary);
    StrX::StrX((StrX *)local_f8,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_f8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xda7,lex_v_2 + 8,pcVar4,1);
    StrX::~StrX((StrX *)local_f8);
    errSeen = true;
  }
  local_fc = st_Init;
  StrX::StrX(&local_110,lex_iv_2 + 8);
  pXVar3 = StrX::unicodeForm(&local_110);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_base64Binary,&local_fc,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  local_fd = bVar1 & 1;
  if (local_fd != 1) {
    pXVar3 = getDataTypeString(dt_base64Binary);
    StrX::StrX((StrX *)local_120,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_120);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xda8,lex_iv_2 + 8,pcVar4,1);
    StrX::~StrX((StrX *)local_120);
    errSeen = true;
  }
  local_124 = st_Init;
  StrX::StrX(&local_138,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_138);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_base64Binary,&local_124,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  local_125 = bVar1 & 1;
  if (local_125 == 0) {
    if (local_124 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_base64Binary);
      StrX::StrX((StrX *)local_158,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_158);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_124);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xdab,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_158);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_base64Binary);
    StrX::StrX(&local_148,pXVar3);
    pcVar4 = StrX::localForm(&local_148);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xdab,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,0);
    StrX::~StrX(&local_148);
    errSeen = true;
  }
  local_15c = st_Init;
  StrX::StrX(&local_170,lex_iv_1);
  pXVar3 = StrX::unicodeForm(&local_170);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_base64Binary,&local_15c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_170);
  local_15d = bVar1 & 1;
  if (local_15d == 0) {
    if (local_15c != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_base64Binary);
      StrX::StrX((StrX *)&myStatus_4,pXVar3);
      pcVar4 = StrX::localForm((StrX *)&myStatus_4);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_15c);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xdac,lex_iv_1,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)&myStatus_4);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_base64Binary);
    StrX::StrX(&local_180,pXVar3);
    pcVar4 = StrX::localForm(&local_180);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xdac,lex_iv_1,pcVar4,0);
    StrX::~StrX(&local_180);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_1b0,lex_v_2 + 8);
    pXVar3 = StrX::unicodeForm(&local_1b0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_base64Binary,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_1b0);
    local_1a0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_base64Binary);
      StrX::StrX((StrX *)local_210,pXVar3);
      StrX::localForm((StrX *)local_210);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdc6,lex_v_2 + 8);
      StrX::~StrX((StrX *)local_210);
      errSeen = true;
    }
    else {
      memcpy(&local_1d8,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_2.fValue + 0x18);
      memcpy(&local_200,pvVar10,0x28);
      actValue.fValue.f_long = uStack_1d0;
      actValue._0_8_ = local_1d8;
      actValue.fValue._8_8_ = local_1c8;
      actValue.fValue._16_8_ = uStack_1c0;
      actValue.fValue.f_datetime.f_milisec = (double)local_1b8;
      expValue.fValue.f_long = uStack_1f8;
      expValue._0_8_ = local_200;
      expValue.fValue._8_8_ = local_1f0;
      expValue.fValue._16_8_ = uStack_1e8;
      expValue.fValue.f_datetime.f_milisec = (double)local_1e0;
      bVar2 = compareActualValue(dt_base64Binary,actValue,expValue);
      pXVar5 = local_1a0;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_1a0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_1a0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_230,lex_iv_2 + 8);
    pXVar3 = StrX::unicodeForm(&local_230);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_base64Binary,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    local_220 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_base64Binary);
      StrX::StrX((StrX *)local_290,pXVar3);
      StrX::localForm((StrX *)local_290);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdc7,lex_iv_2 + 8);
      StrX::~StrX((StrX *)local_290);
      errSeen = true;
    }
    else {
      memcpy(&local_258,pXVar5,0x28);
      pcVar4 = lex_v_1_canrep + 8;
      memcpy(&local_280,pcVar4,0x28);
      actValue_00.fValue.f_long = uStack_250;
      actValue_00._0_8_ = local_258;
      actValue_00.fValue._8_8_ = local_248;
      actValue_00.fValue._16_8_ = uStack_240;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_238;
      expValue_00.fValue.f_long = uStack_278;
      expValue_00._0_8_ = local_280;
      expValue_00.fValue._8_8_ = local_270;
      expValue_00.fValue._16_8_ = uStack_268;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_260;
      bVar2 = compareActualValue(dt_base64Binary,actValue_00,expValue_00);
      pXVar5 = local_220;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_220 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_220);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pcVar4);
      }
    }
    actRetValue_2._4_4_ = st_Init;
    StrX::StrX(&local_2b0,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_2b0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_base64Binary,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_2b0);
    local_2a0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_2._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_base64Binary);
        StrX::StrX((StrX *)local_2d0,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_2d0);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_2._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xdca,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_2d0);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_base64Binary);
      StrX::StrX(&local_2c0,pXVar3);
      StrX::localForm(&local_2c0);
      pvVar10 = (void *)0xdca;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdca,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_2c0);
      pXVar5 = local_2a0;
      errSeen = true;
      if (local_2a0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2a0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_2f0,lex_iv_1);
    pXVar3 = StrX::unicodeForm(&local_2f0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_base64Binary,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_2f0);
    local_2e0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_3._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_base64Binary);
        StrX::StrX((StrX *)&myStatus_8,pXVar3);
        pcVar4 = StrX::localForm((StrX *)&myStatus_8);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_3._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xdcb,lex_iv_1,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)&myStatus_8);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_base64Binary);
      StrX::StrX(&local_300,pXVar3);
      StrX::localForm(&local_300);
      pvVar10 = (void *)0xdcb;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdcb,lex_iv_1);
      StrX::~StrX(&local_300);
      pXVar5 = local_2e0;
      errSeen = true;
      if (local_2e0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2e0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar,lex_v_2 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_base64Binary,(Status *)&actRetCanRep,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar);
    local_320 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_base64Binary);
      StrX::StrX((StrX *)local_358,pXVar3);
      StrX::localForm((StrX *)local_358);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xde7,lex_v_2 + 8);
      StrX::~StrX((StrX *)local_358);
      errSeen = true;
    }
    else {
      local_338 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_338,lex_v_2_canrep + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_base64Binary);
        StrX::StrX(&local_348,pXVar3);
        pcVar4 = StrX::localForm(&local_348);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xde7,lex_v_2 + 8,pcVar4,local_338,lex_v_2_canrep + 8);
        StrX::~StrX(&local_348);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_320);
      xercesc_4_0::XMLString::release(&local_338,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_1._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_1,lex_iv_2 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_1);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_base64Binary,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_1);
    local_368 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_base64Binary);
      StrX::StrX((StrX *)local_3a0,pXVar3);
      StrX::localForm((StrX *)local_3a0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xde8,lex_iv_2 + 8);
      StrX::~StrX((StrX *)local_3a0);
      errSeen = true;
    }
    else {
      local_380 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_380,acStack_c0);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_base64Binary);
        StrX::StrX(&local_390,pXVar3);
        pcVar4 = StrX::localForm(&local_390);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xde8,lex_iv_2 + 8,pcVar4,local_380,acStack_c0);
        StrX::~StrX(&local_390);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_368);
      xercesc_4_0::XMLString::release(&local_380,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_2._4_4_ = st_Init;
    StrX::StrX(&local_3c0,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_3c0);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_base64Binary,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3c0);
    local_3b0 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_2._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_base64Binary);
        StrX::StrX((StrX *)local_3e0,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_3e0);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_2._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xdeb,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_3e0);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_base64Binary);
      StrX::StrX(&local_3d0,pXVar3);
      StrX::localForm(&local_3d0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdeb,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_3d0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_3b0);
      errSeen = true;
    }
    actRetCanRep_3._4_4_ = st_Init;
    StrX::StrX(&local_400,lex_iv_1);
    pXVar3 = StrX::unicodeForm(&local_400);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_base64Binary,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_400);
    local_3f0 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_3._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_base64Binary);
        StrX::StrX(&local_420,pXVar3);
        pcVar4 = StrX::localForm(&local_420);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_3._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xdec,lex_iv_1,pcVar4,pcVar6,pcVar7);
        StrX::~StrX(&local_420);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_base64Binary);
      StrX::StrX(&local_410,pXVar3);
      StrX::localForm(&local_410);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdec,lex_iv_1);
      StrX::~StrX(&local_410);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_3f0);
      errSeen = true;
    }
  }
  return;
}

Assistant:

void test_dt_base64Binary()
{
    const XSValue::DataType dt = XSValue::dt_base64Binary;
    bool  toValidate = true;

    const char lex_v_1[]="  134x cv56 gui0   \n";
    const char lex_v_2[]="wxtz 8e4k";

    const char lex_iv_2[]="134xcv56gui";
    const char lex_iv_1[]="wxtz8e4";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    //actual values:
    //"134x cv56 gui0"  :     D7 7E 31 72 FE 7A 82 E8 B4
    //"wxtz 8e4k"       :     C3 1B 73 F1 EE 24
    act_v_ran_v_1.fValue.f_byteVal = new XMLByte[9];
    act_v_ran_v_1.fValue.f_byteVal[0] = 0xd7;
    act_v_ran_v_1.fValue.f_byteVal[1] = 0x7e;
    act_v_ran_v_1.fValue.f_byteVal[2] = 0x31;
    act_v_ran_v_1.fValue.f_byteVal[3] = 0x72;
    act_v_ran_v_1.fValue.f_byteVal[4] = 0xfe;
    act_v_ran_v_1.fValue.f_byteVal[5] = 0x7a;
    act_v_ran_v_1.fValue.f_byteVal[6] = 0x82;
    act_v_ran_v_1.fValue.f_byteVal[7] = 0xe8;
    act_v_ran_v_1.fValue.f_byteVal[8] = 0xb4;
    act_v_ran_v_2.fValue.f_byteVal = new XMLByte[9];
    act_v_ran_v_2.fValue.f_byteVal[0] = 0xc3;
    act_v_ran_v_2.fValue.f_byteVal[1] = 0x1b;
    act_v_ran_v_2.fValue.f_byteVal[2] = 0x73;
    act_v_ran_v_2.fValue.f_byteVal[3] = 0xf1;
    act_v_ran_v_2.fValue.f_byteVal[4] = 0xee;
    act_v_ran_v_2.fValue.f_byteVal[5] = 0x24;
    act_v_ran_v_2.fValue.f_byteVal[6] = 0;
    act_v_ran_v_2.fValue.f_byteVal[7] = 0;
    act_v_ran_v_2.fValue.f_byteVal[8] = 0;

    const char lex_v_1_canrep[]="134xcv56gui0";
    const char lex_v_2_canrep[]="wxtz8e4k";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid                                  true              n/a
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid
    VALIDATE_TEST(lex_v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(lex_v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid                                    XSValue         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid                                    XSValue         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        // lexical valid
        ACTVALUE_TEST(lex_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);

        // lexical invalid
        ACTVALUE_TEST(lex_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(lex_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *  lexical valid                                    XMLCh            n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid                                    XMLCh            n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        // lexical valid
        CANREP_TEST(lex_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE, lex_v_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE, lex_v_2_canrep, DONT_CARE);

        // lexical invalid
        CANREP_TEST(lex_iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,   XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,   XSValue::st_FOCA0002);
    }

}